

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZQuadTorus.cpp
# Opt level: O3

void pzgeom::TPZQuadTorus::InsertExampleElement
               (TPZGeoMesh *gmesh,int matid,TPZVec<double> *lowercorner,TPZVec<double> *size)

{
  ulong uVar1;
  double dVar2;
  int64_t iVar3;
  int iVar4;
  TPZGeoNode *this;
  TPZGeoElRefPattern<pzgeom::TPZQuadTorus> *this_00;
  ulong uVar5;
  double *pdVar6;
  long lVar7;
  TPZManVector<double,_2> loc;
  TPZManVector<long,_4> indexes;
  TPZFNMatrix<12,_double> phitheta;
  TPZManVector<double,_3> xco;
  TPZVec<double> local_3a8;
  double local_388;
  double dStack_380;
  TPZVec<long> local_378;
  long local_358 [4];
  TPZManVector<double,_3> local_338;
  TPZFMatrix<double> local_300;
  double local_270 [13];
  TPZManVector<double,_3> local_208;
  TPZQuadTorus local_1d0;
  
  pdVar6 = size->fStore;
  *pdVar6 = 2.0;
  pdVar6[1] = 2.0;
  pdVar6[2] = 1.0;
  local_338.super_TPZVec<double>.fStore = (double *)0x0;
  local_338.super_TPZVec<double>.fNElements = 0;
  local_338.super_TPZVec<double>.fNAlloc = 0;
  local_338.super_TPZVec<double>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01819f98;
  uVar1 = lowercorner->fNElements;
  if ((long)uVar1 < 4) {
    local_338.super_TPZVec<double>.fStore = local_338.fExtAlloc;
    local_338.super_TPZVec<double>.fNElements = uVar1;
    if ((long)uVar1 < 1) {
      dVar2 = NAN;
      goto LAB_00efa33f;
    }
  }
  else {
    local_338.super_TPZVec<double>.fStore =
         (double *)operator_new__(-(ulong)(uVar1 >> 0x3d != 0) | uVar1 * 8);
    local_338.super_TPZVec<double>.fNElements = uVar1;
    local_338.super_TPZVec<double>.fNAlloc = uVar1;
  }
  pdVar6 = lowercorner->fStore;
  uVar5 = 0;
  do {
    local_338.super_TPZVec<double>.fStore[uVar5] = pdVar6[uVar5];
    uVar5 = uVar5 + 1;
  } while (uVar1 != uVar5);
  dVar2 = *local_338.super_TPZVec<double>.fStore + 1.0;
  local_338.super_TPZVec<double>.fNElements = uVar1;
LAB_00efa33f:
  *local_338.super_TPZVec<double>.fStore = dVar2;
  local_300.fElem = local_270;
  local_300.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 2;
  local_300.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 4;
  local_300.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_300.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_300.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_018874b0;
  local_300.fSize = 0xc;
  local_300.fGiven = local_300.fElem;
  TPZVec<int>::TPZVec(&local_300.fPivot.super_TPZVec<int>,0);
  local_300.fPivot.super_TPZVec<int>.fStore = local_300.fPivot.fExtAlloc;
  local_300.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_300.fPivot.super_TPZVec<int>.fNElements = 0;
  local_300.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_300.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  local_300.fWork.fStore = (double *)0x0;
  local_300.fWork.fNElements = 0;
  local_300.fWork.fNAlloc = 0;
  local_300.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_018871c0;
  TPZFMatrix<double>::operator=(&local_300,0.0);
  pdVar6 = local_300.fElem;
  iVar3 = local_300.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow;
  if ((local_300.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 1) ||
     (local_300.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  *local_300.fElem = 0.0;
  if ((iVar3 < 2) || (local_300.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  pdVar6[1] = 0.0;
  if ((iVar3 < 1) || (local_300.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 2)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  pdVar6[iVar3] = 1.0471975511965976;
  if ((iVar3 < 2) || (local_300.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 2)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  pdVar6[iVar3 + 1] = 0.0;
  if ((iVar3 < 1) || (local_300.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 3)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  pdVar6[iVar3 * 2] = 1.0471975511965976;
  if ((iVar3 < 2) || (local_300.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 3)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  pdVar6[iVar3 * 2 + 1] = 3.141592653589793;
  if ((iVar3 < 1) || (local_300.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 4)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  pdVar6[iVar3 * 3] = 0.0;
  if ((1 < iVar3) && (3 < local_300.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol)) {
    pdVar6[iVar3 * 3 + 1] = 3.141592653589793;
    TPZQuadTorus(&local_1d0);
    SetOrigin(&local_1d0,&local_338.super_TPZVec<double>);
    local_1d0.fR = 1.0;
    local_1d0.fr = 0.8;
    TPZFMatrix<double>::operator=(&local_1d0.fPhiTheta.super_TPZFMatrix<double>,&local_300);
    TPZVec<long>::TPZVec(&local_378,0);
    local_378.fStore = local_358;
    local_378._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01878bc8;
    local_378.fNElements = 4;
    local_378.fNAlloc = 0;
    pdVar6 = (double *)&DAT_01522ad0;
    lVar7 = 0;
    do {
      iVar4 = TPZAdmChunkVector<TPZGeoNode,_10>::AllocateNewElement(&gmesh->fNodeVec);
      local_378.fStore[lVar7] = (long)iVar4;
      TPZManVector<double,_3>::TPZManVector(&local_208,3);
      TPZVec<double>::TPZVec(&local_3a8,0);
      local_3a8._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0181c090;
      local_3a8.fStore = &local_388;
      local_3a8.fNElements = 2;
      local_3a8.fNAlloc = 0;
      local_388 = *pdVar6;
      dStack_380 = pdVar6[1];
      X<double>(&local_1d0,&local_300,&local_3a8,&local_208.super_TPZVec<double>);
      this = TPZChunkVector<TPZGeoNode,_10>::operator[]
                       (&(gmesh->fNodeVec).super_TPZChunkVector<TPZGeoNode,_10>,
                        local_378.fStore[lVar7]);
      TPZGeoNode::Initialize(this,&local_208.super_TPZVec<double>,gmesh);
      if (local_3a8.fStore != &local_388) {
        local_3a8.fNAlloc = 0;
        local_3a8._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
        if (local_3a8.fStore != (double *)0x0) {
          operator_delete__(local_3a8.fStore);
        }
      }
      TPZManVector<double,_3>::~TPZManVector(&local_208);
      lVar7 = lVar7 + 1;
      pdVar6 = pdVar6 + 2;
    } while (lVar7 != 4);
    this_00 = (TPZGeoElRefPattern<pzgeom::TPZQuadTorus> *)operator_new(0x2e0);
    TPZGeoElRefPattern<pzgeom::TPZQuadTorus>::TPZGeoElRefPattern(this_00,&local_378,matid,gmesh);
    SetOrigin(&(this_00->super_TPZGeoElRefLess<pzgeom::TPZQuadTorus>).fGeo,
              &local_338.super_TPZVec<double>);
    (this_00->super_TPZGeoElRefLess<pzgeom::TPZQuadTorus>).fGeo.fR = 1.0;
    (this_00->super_TPZGeoElRefLess<pzgeom::TPZQuadTorus>).fGeo.fr = 0.8;
    TPZFMatrix<double>::operator=
              (&(this_00->super_TPZGeoElRefLess<pzgeom::TPZQuadTorus>).fGeo.fPhiTheta.
                super_TPZFMatrix<double>,&local_300);
    if (local_378.fStore != local_358) {
      local_378.fNAlloc = 0;
      local_378._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813f30;
      if (local_378.fStore != (long *)0x0) {
        operator_delete__(local_378.fStore);
      }
    }
    local_1d0.super_TPZGeoQuad.super_TPZNodeRep<4,_pztopology::TPZQuadrilateral>.
    super_TPZQuadrilateral.super_TPZSavable._vptr_TPZSavable =
         (TPZSavable)&PTR__TPZQuadTorus_0189d0f8;
    TPZFMatrix<double>::~TPZFMatrix(&local_1d0.fPhiTheta.super_TPZFMatrix<double>,&PTR_PTR_01887478)
    ;
    TPZManVector<double,_10>::~TPZManVector(&local_1d0.fOrigin);
    TPZFMatrix<double>::~TPZFMatrix(&local_300,&PTR_PTR_01887478);
    TPZManVector<double,_3>::~TPZManVector(&local_338);
    return;
  }
  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h",
             0x26d);
}

Assistant:

void pzgeom::TPZQuadTorus::InsertExampleElement(TPZGeoMesh &gmesh, int matid, TPZVec<REAL> &lowercorner, TPZVec<REAL> &size)
    {
        REAL R = 1., r = 0.8;
        size[0] = 2.;
        size[1] = 2.;
        size[2] = 1.;
        TPZManVector<REAL,3> origin(lowercorner);
        origin[0] += 1.;        
        TPZFNMatrix<12,REAL> phitheta(2,4,0.);
        phitheta(0,0) = 0.;
        phitheta(1,0) = 0;
        
        phitheta(0,1) = M_PI/3;
        phitheta(1,1) = 0;
        
        phitheta(0,2) = M_PI/3;
        phitheta(1,2) = M_PI;
        
        phitheta(0,3) = 0.;
        phitheta(1,3) = M_PI;

        TPZQuadTorus torus;
        torus.SetOrigin(origin);
        torus.SetDataRadius(R, r);
        torus.SetDataPhiTheta(phitheta);
        TPZManVector<int64_t,4> indexes(4);
        constexpr REAL coords[4][2] = {
            {-1,-1},{1,-1},{1,1},{-1,1}
        };
        for (int i=0; i<4; i++) {
            indexes[i] = gmesh.NodeVec().AllocateNewElement();
            TPZManVector<REAL,3> xco(3);
            TPZManVector<REAL, 2>loc(2);
            loc[0] = coords[i][0];
            loc[1] = coords[i][1];
            torus.X(phitheta, loc, xco);
            gmesh.NodeVec()[indexes[i]].Initialize(xco, gmesh);
        }
        TPZGeoElRefPattern<pzgeom::TPZQuadTorus> *gel = new TPZGeoElRefPattern<pzgeom::TPZQuadTorus>(indexes,matid,gmesh);
        gel->Geom().SetOrigin(origin);
        gel->Geom().SetDataRadius(R, r);
        gel->Geom().SetDataPhiTheta(phitheta);
    }